

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O3

void __thiscall
cmVariableWatch::RemoveWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data)

{
  Pair *pPVar1;
  pointer __dest;
  const_iterator cVar2;
  mapped_type *pmVar3;
  pointer ppPVar4;
  pointer __src;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
                  *)this,variable);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->WatchMap)._M_t._M_impl.super__Rb_tree_header) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
             ::operator[](&this->WatchMap,variable);
    ppPVar4 = (pmVar3->
              super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    __dest = ppPVar4;
    for (; ppPVar4 !=
           (pmVar3->
           super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>).
           _M_impl.super__Vector_impl_data._M_finish; ppPVar4 = ppPVar4 + 1) {
      __src = __dest + 1;
      pPVar1 = *ppPVar4;
      if ((pPVar1->Method == method) &&
         ((client_data == (void *)0x0 || (pPVar1->ClientData == client_data)))) {
        if ((pPVar1->DeleteDataCall != (DeleteData)0x0) && (pPVar1->ClientData != (void *)0x0)) {
          (*pPVar1->DeleteDataCall)(pPVar1->ClientData);
        }
        operator_delete(pPVar1,0x18);
        ppPVar4 = (pmVar3->
                  super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (__src != ppPVar4) {
          memmove(__dest,__src,(long)ppPVar4 - (long)__src);
          ppPVar4 = (pmVar3->
                    super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        (pmVar3->
        super__Vector_base<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>).
        _M_impl.super__Vector_impl_data._M_finish = ppPVar4 + -1;
        return;
      }
      __dest = __src;
    }
  }
  return;
}

Assistant:

void cmVariableWatch::RemoveWatch(const std::string& variable,
                                  WatchMethod method,
                                  void* client_data /*=0*/)
{
  if ( !this->WatchMap.count(variable) )
    {
    return;
    }
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::iterator it;
  for ( it = vp->begin(); it != vp->end(); ++it )
    {
    if ( (*it)->Method == method &&
         // If client_data is NULL, we want to disconnect all watches against
         // the given method; otherwise match ClientData as well.
         (!client_data || (client_data == (*it)->ClientData)))
      {
      delete *it;
      vp->erase(it);
      return;
      }
    }
}